

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Production * lookup_production(Grammar *g,char *name,uint l)

{
  uint uVar1;
  Production *pPVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (g->productions).n;
  uVar4 = 0;
  while( true ) {
    if (uVar1 <= uVar4) {
      return (Production *)0x0;
    }
    pPVar2 = (g->productions).v[uVar4];
    if ((pPVar2->name_len == l) && (iVar3 = strncmp(pPVar2->name,name,(ulong)l), iVar3 == 0)) break;
    uVar4 = uVar4 + 1;
  }
  return pPVar2;
}

Assistant:

Production *lookup_production(Grammar *g, char *name, uint l) {
  uint i;

  for (i = 0; i < g->productions.n; i++) {
    Production *pp = g->productions.v[i];
    if (pp->name_len != l || strncmp(pp->name, name, l)) continue;
    return pp;
  }
  return NULL;
}